

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

ptr<async_result<bool>_> __thiscall
cornerstone::raft_server::add_srv(raft_server *this,srv_config *srv)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  ptr<async_result<bool>_> pVar2;
  bufptr buf;
  ptr<req_msg> req;
  ptr<log_entry> log;
  _func_int **local_48;
  _Alloc_hider _Stack_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  undefined1 local_30 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  srv_config::serialize((srv_config *)&local_48);
  local_30._8_8_ = 0;
  local_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  local_20->_M_use_count = 1;
  local_20->_M_weak_count = 1;
  local_20->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00178648;
  local_30._8_8_ = local_20 + 1;
  local_20[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_20[1]._M_use_count = 3;
  local_20[2]._vptr__Sp_counted_base = local_48;
  *(pointer *)&local_20[2]._M_use_count = _Stack_40._M_p;
  _Stack_40._M_p = (pointer)0x0;
  local_20[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_30._0_8_ = operator_new(0x60);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._0_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._0_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._0_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00178590;
  local_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_30._0_8_ + 0x10);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_30._0_8_ + 0x10))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_30._0_8_ + 0x10))->_M_weak_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_30._0_8_ + 0x20))->_vptr__Sp_counted_base
       = (_func_int **)0x6;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_30._0_8_ + 0x20))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_30._0_8_ + 0x10))->_vptr__Sp_counted_base
       = (_func_int **)&PTR__req_msg_001785e0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_30._0_8_ + 0x30))->_vptr__Sp_counted_base
       = (_func_int **)0x0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_30._0_8_ + 0x30))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_30._0_8_ + 0x30))->_M_weak_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_30._0_8_ + 0x40))->_vptr__Sp_counted_base
       = (_func_int **)0x0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_30._0_8_ + 0x40))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_30._0_8_ + 0x40))->_M_weak_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_30._0_8_ + 0x50))->_vptr__Sp_counted_base
       = (_func_int **)0x0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_30._0_8_ + 0x50))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_30._0_8_ + 0x50))->_M_weak_count = 0;
  std::
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  ::push_back((vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
               *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_30._0_8_ + 0x40))->
                  _M_use_count,(value_type *)(local_30 + 8));
  pVar2 = send_msg_to_leader(this,(ptr<req_msg> *)srv);
  _Var1 = pVar2.
          super___shared_ptr<cornerstone::async_result<bool,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._0_8_);
    _Var1._M_pi = extraout_RDX;
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    _Var1._M_pi = extraout_RDX_00;
  }
  if (_Stack_40._M_p != (pointer)0x0) {
    (*(code *)local_48)();
    _Var1._M_pi = extraout_RDX_01;
  }
  pVar2.
  super___shared_ptr<cornerstone::async_result<bool,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  pVar2.
  super___shared_ptr<cornerstone::async_result<bool,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ptr<async_result<bool>_>)
         pVar2.
         super___shared_ptr<cornerstone::async_result<bool,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<async_result<bool>> raft_server::add_srv(const srv_config& srv)
{
    bufptr buf(srv.serialize());
    ptr<log_entry> log(cs_new<log_entry>(0, std::move(buf), log_val_type::cluster_server));
    ptr<req_msg> req(cs_new<req_msg>((ulong)0, msg_type::add_server_request, 0, 0, (ulong)0, (ulong)0, (ulong)0));
    req->log_entries().push_back(log);
    return send_msg_to_leader(req);
}